

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

int utils::mkdir(char *__path,__mode_t __mode)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  allocator local_239;
  string currentPath;
  string local_218 [32];
  string dirName;
  string local_1d8;
  stringstream ss;
  
  std::__cxx11::string::string((string *)&currentPath,"",(allocator *)&ss);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  dirName._M_string_length = 0;
  dirName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string(local_218,__path,&local_239);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,local_218,_S_out|_S_in);
  std::__cxx11::string::~string(local_218);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&dirName,'/');
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::append((string *)&currentPath);
    std::__cxx11::string::string((string *)&local_1d8,(string *)&currentPath);
    bVar1 = dirExists(&local_1d8);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      iVar2 = ::mkdir(currentPath._M_dataplus._M_p,0x1fd);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (iVar2 != 0) break;
    }
    std::__cxx11::string::append((char *)&currentPath);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&dirName);
  iVar2 = std::__cxx11::string::~string((string *)&currentPath);
  return iVar2;
}

Assistant:

static inline int mkdir(const char *path) {
  std::string currentPath = "";
  std::string dirName;
  std::stringstream ss(path);

  while (std::getline(ss, dirName, '/')) {
    currentPath += dirName;
    if (!dirExists(currentPath) && _mkdir(currentPath.c_str()) != 0) {
      return -1;
    }
    currentPath += "/";
  }
  return 0;
}